

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7.c
# Opt level: O2

void Ppmd7_Update1_0(CPpmd7 *p)

{
  byte bVar1;
  ushort uVar2;
  CPpmd_State *pCVar3;
  byte bVar4;
  uint uVar5;
  
  pCVar3 = p->FoundState;
  bVar1 = pCVar3->Freq;
  bVar4 = bVar1 + 4;
  uVar2 = p->MinContext->SummFreq;
  uVar5 = (uint)(uVar2 < (ushort)((ushort)bVar1 * 2));
  p->PrevSuccess = uVar5;
  p->RunLength = p->RunLength + uVar5;
  p->MinContext->SummFreq = uVar2 + 4;
  pCVar3->Freq = bVar4;
  if (0x7c < bVar4) {
    Rescale(p);
  }
  NextContext(p);
  return;
}

Assistant:

void Ppmd7_Update1_0(CPpmd7 *p)
{
  p->PrevSuccess = (2 * p->FoundState->Freq > p->MinContext->SummFreq);
  p->RunLength += p->PrevSuccess;
  p->MinContext->SummFreq += 4;
  if ((p->FoundState->Freq += 4) > MAX_FREQ)
    Rescale(p);
  NextContext(p);
}